

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O1

double __thiscall
Alg::opimb_naive(Alg *this,Graph *graph,double budget,
                vector<double,_std::allocator<double>_> *budget_list,double epsilon,double delta,
                int mode)

{
  double *pdVar1;
  TResult *pTVar2;
  bool bVar3;
  HyperGraph *this_00;
  char cVar4;
  int iVar5;
  int iVar6;
  const_iterator __begin1;
  long *plVar7;
  double *pdVar8;
  ostream *poVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  double *pdVar14;
  size_t numSamples;
  Graph *graph_00;
  uint uVar15;
  ulong uVar16;
  bool bVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar24;
  vector<double,_std::allocator<double>_> *__range1;
  double timeb;
  char local_179;
  double local_178;
  double local_170;
  double local_168;
  double local_160;
  undefined1 local_158 [16];
  double local_140;
  double local_138;
  vector<double,_std::allocator<double>_> *local_130;
  double local_128;
  undefined8 uStack_120;
  double local_110;
  int local_104;
  ulong local_100;
  double local_f8;
  Nodelist *local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double dStack_d0;
  Nodelist *local_c8;
  Nodelist *local_c0;
  long local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  HyperGraph *local_90;
  HyperGraph *local_88;
  long local_80;
  double local_78;
  double local_70;
  ulong local_68;
  vector<double,_std::allocator<double>_> local_60;
  vector<double,_std::allocator<double>_> local_48;
  
  local_158._8_8_ = local_158._0_8_;
  local_168 = delta;
  local_140 = budget;
  local_138 = epsilon;
  local_130 = budget_list;
  local_b8 = std::chrono::_V2::system_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"mode: ",6);
  local_104 = mode;
  plVar7 = (long *)std::ostream::operator<<((ostream *)&std::cout,mode);
  std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  std::ostream::put((char)plVar7);
  std::ostream::flush();
  local_170 = 6.0 / local_168;
  dVar24 = log(local_170);
  if (dVar24 < 0.0) {
    local_158._0_8_ = sqrt(dVar24);
  }
  else {
    local_158._0_8_ = SQRT(dVar24);
  }
  std::vector<double,_std::allocator<double>_>::vector(&local_48,local_130);
  iVar5 = cal_k_max(&local_48,local_140);
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<double,_std::allocator<double>_>::vector(&local_60,local_130);
  iVar6 = cal_k_min(&local_60,local_140);
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pdVar8 = (local_130->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar1 = (local_130->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar8 == pdVar1) {
    uVar18 = 0;
    uVar19 = 0;
  }
  else {
    dVar24 = 0.0;
    pdVar14 = pdVar8;
    do {
      dVar20 = *pdVar14;
      uVar18 = SUB84(dVar20,0);
      uVar19 = (undefined4)((ulong)dVar20 >> 0x20);
      if (dVar20 <= dVar24) {
        uVar18 = SUB84(dVar24,0);
        uVar19 = (undefined4)((ulong)dVar24 >> 0x20);
      }
      pdVar14 = pdVar14 + 1;
      dVar24 = (double)CONCAT44(uVar19,uVar18);
    } while (pdVar14 != pdVar1);
  }
  local_178 = (double)CONCAT44(local_178._4_4_,(int)(local_140 / (double)CONCAT44(uVar19,uVar18)));
  if (pdVar8 == pdVar1) {
    dVar24 = 4294967295.0;
  }
  else {
    dVar24 = 4294967295.0;
    do {
      dVar20 = *pdVar8;
      dVar24 = (double)(~-(ulong)(dVar20 < dVar24) & (ulong)dVar24 |
                       (~-(ulong)(0.0001 < ABS(dVar20)) & (ulong)dVar24 |
                       -(ulong)(0.0001 < ABS(dVar20)) & (ulong)dVar20) & -(ulong)(dVar20 < dVar24));
      pdVar8 = pdVar8 + 1;
    } while (pdVar8 != pdVar1);
  }
  dVar24 = local_140 / dVar24;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"k_max: ",7);
  plVar7 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar5);
  std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  std::ostream::put((char)plVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"k_min: ",7);
  plVar7 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar6);
  std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  std::ostream::put((char)plVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"targetSize_max: ",0x10);
  plVar7 = (long *)std::ostream::operator<<((ostream *)&std::cout,(int)dVar24);
  std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  std::ostream::put((char)plVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"targetSize_min: ",0x10);
  plVar7 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_178._0_4_);
  std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  std::ostream::put((char)plVar7);
  std::ostream::flush();
  dVar24 = (double)this->__numV;
  local_128 = dVar24 + dVar24;
  local_178 = (double)iVar5;
  local_160 = log(dVar24);
  dVar24 = log(local_170);
  dVar24 = (local_160 * local_178 + dVar24) * 0.31606027941427883;
  if (dVar24 < 0.0) {
    dVar24 = sqrt(dVar24);
  }
  else {
    dVar24 = SQRT(dVar24);
  }
  dVar20 = (double)local_158._0_8_ * 0.31606027941427883;
  local_158._0_8_ = dVar20;
  dVar24 = dVar24 + dVar20;
  dVar20 = (double)this->__numV;
  dVar24 = (local_128 * dVar24 * dVar24) / dVar20;
  local_100 = (ulong)dVar24;
  local_100 = (long)(dVar24 - 9.223372036854776e+18) & (long)local_100 >> 0x3f | local_100;
  local_128 = dVar20 + dVar20;
  uStack_120 = 0;
  local_160 = log(dVar20);
  dVar24 = log(local_170);
  dVar24 = (local_160 * local_178 + dVar24) * 0.31606027941427883;
  if (dVar24 < 0.0) {
    dVar24 = sqrt(dVar24);
  }
  else {
    dVar24 = SQRT(dVar24);
  }
  dVar24 = (local_128 * ((double)local_158._0_8_ + dVar24) * ((double)local_158._0_8_ + dVar24)) /
           (local_138 * local_138 * local_178);
  uVar13 = (ulong)dVar24;
  uVar16 = 0;
  uVar13 = ((long)(dVar24 - 9.223372036854776e+18) & (long)uVar13 >> 0x3f | uVar13) / local_100;
  auVar21._8_4_ = (int)(uVar13 >> 0x20);
  auVar21._0_8_ = uVar13;
  auVar21._12_4_ = 0x45300000;
  dVar24 = log((auVar21._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar13) - 4503599627370496.0));
  uVar13 = (ulong)(dVar24 / 0.6931471805599453);
  local_80 = ((long)(dVar24 / 0.6931471805599453 - 9.223372036854776e+18) & (long)uVar13 >> 0x3f |
             uVar13) + 1;
  auVar22._8_4_ = (int)((ulong)local_80 >> 0x20);
  auVar22._0_8_ = local_80;
  auVar22._12_4_ = 0x45300000;
  dVar20 = auVar22._8_8_ - 1.9342813113834067e+25;
  dVar24 = ((dVar20 + ((double)CONCAT44(0x43300000,(int)local_80) - 4503599627370496.0)) * 3.0) /
           local_168;
  local_158._8_4_ = SUB84(dVar20,0);
  local_158._0_8_ = dVar24;
  local_158._12_4_ = (int)((ulong)dVar20 >> 0x20);
  local_110 = log(dVar24);
  local_128 = log((double)local_158._0_8_);
  local_e0 = 0.0;
  local_88 = &this->__hyperG;
  local_90 = &this->__hyperGVldt;
  local_f0 = &this->__vecSeed;
  local_98 = (local_110 + local_110) / 9.0;
  local_f8 = local_110 * 0.5;
  local_110 = local_110 / 18.0;
  local_128 = local_128 * 0.5;
  local_a0 = 0.31606027941427883 - local_138;
  local_c0 = &this->__vecSeed_inf;
  local_c8 = &this->__vecSeed_inf_cost;
  local_a8 = SQRT(local_f8);
  local_b0 = SQRT(local_128);
  local_178 = 0.0;
  local_168 = 0.0;
  local_160 = 0.0;
  do {
    dVar24 = local_160;
    local_68 = uVar16;
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    numSamples = local_100 << (SUB81(dVar24,0) & 0x3f);
    lVar10 = std::chrono::_V2::system_clock::now();
    HyperGraph::build_n_RRsets(local_88,numSamples);
    this_00 = local_90;
    HyperGraph::build_n_RRsets(local_90,numSamples);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"# RR sets: ",0xb);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    cVar4 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    graph_00 = (Graph *)(ulong)(uint)(int)cVar4;
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    this->__numRRsets = (this->__hyperG).__numRRsets;
    lVar11 = std::chrono::_V2::system_clock::now();
    dVar24 = max_cover_lazy_budget(this,graph_00,local_140,local_130,&local_e0,local_104);
    local_158._0_8_ = dVar24;
    lVar12 = std::chrono::_V2::system_clock::now();
    local_e8 = HyperGraph::self_inf_cal(this_00,local_f0);
    auVar23._0_8_ = (double)CONCAT44(0x43300000,(int)this->__numRRsets);
    auVar23._8_4_ = (int)(this->__numRRsets >> 0x20);
    auVar23._12_4_ = 0x45300000;
    dStack_d0 = auVar23._8_8_ - 1.9342813113834067e+25;
    local_d8 = dStack_d0 + (auVar23._0_8_ - 4503599627370496.0);
    local_78 = (double)this->__numV;
    dVar24 = (local_e8 * local_d8) / local_78 + local_98;
    local_138 = (double)local_158._0_8_ / 0.31606027941427883;
    if (dVar24 < 0.0) {
      local_170 = sqrt(dVar24);
    }
    else {
      local_170 = SQRT(dVar24);
    }
    uVar18 = SUB84(local_a8,0);
    uVar19 = (undefined4)((ulong)local_a8 >> 0x20);
    if (local_f8 < 0.0) {
      dVar24 = sqrt(local_f8);
      uVar18 = SUB84(dVar24,0);
      uVar19 = (undefined4)((ulong)dVar24 >> 0x20);
    }
    uVar16 = local_68;
    dVar24 = (local_d8 * local_138) / local_78 + local_128;
    local_70 = (double)CONCAT44(uVar19,uVar18);
    if (dVar24 < 0.0) {
      dVar24 = sqrt(dVar24);
    }
    else {
      dVar24 = SQRT(dVar24);
    }
    uVar18 = SUB84(local_b0,0);
    uVar19 = (undefined4)((ulong)local_b0 >> 0x20);
    if (local_128 < 0.0) {
      local_d8 = dVar24;
      dVar24 = sqrt(local_128);
      uVar18 = SUB84(dVar24,0);
      uVar19 = (undefined4)((ulong)dVar24 >> 0x20);
      dVar24 = local_d8;
    }
    dVar24 = dVar24 + (double)CONCAT44(uVar19,uVar18);
    local_168 = local_168 + (double)(lVar11 - lVar10) / 1000000000.0;
    local_178 = local_178 + (double)(lVar12 - lVar11) / 1000000000.0;
    dVar20 = (local_170 - local_70) * (local_170 - local_70) - local_110;
    local_170 = 0.0;
    if (0.0 <= dVar20) {
      local_170 = dVar20;
    }
    local_170 = local_170 / (dVar24 * dVar24);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," -->OPIM-B-NAIVE (",0x12);
    lVar10 = (long)local_160 + 1;
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"/",1);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,") approx. (max-cover): ",0x17);
    poVar9 = std::ostream::_M_insert<double>(local_170);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," (",2);
    poVar9 = std::ostream::_M_insert<double>((double)local_158._0_8_ / local_138);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"), #RR sets: ",0xd);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    local_179 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_179,1);
    bVar3 = local_170 < local_a0;
    uVar15 = (uint)uVar16;
    bVar17 = uVar15 != 1;
    if (bVar17 || bVar3) {
      if (uVar15 == 0) {
        uVar15 = 1;
      }
      uVar16 = uVar16 & 0xffffffff;
      local_160 = (double)lVar10;
      if (local_a0 <= local_170) {
        uVar16 = (ulong)uVar15;
      }
    }
    else {
      pTVar2 = this->__tRes;
      pTVar2->__Approx = local_170;
      lVar10 = std::chrono::_V2::system_clock::now();
      pTVar2->__RunningTime = (double)(lVar10 - local_b8) / 1000000000.0;
      pTVar2 = this->__tRes;
      pTVar2->__Influence = local_e8;
      pTVar2->__InfluenceOriginal = (double)local_158._0_8_;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (&pTVar2->__VecSeed,local_f0);
      pTVar2->__SeedSize =
           (int)((ulong)((long)(this->__vecSeed).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->__vecSeed).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 2);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (&this->__tRes->__VecSeed_inf,local_c0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (&this->__tRes->__VecSeed_inf_cost,local_c8);
      pTVar2 = this->__tRes;
      pTVar2->__BoundMin_inf = this->__boundMin_inf;
      pTVar2->__BoundMin_inf_cost = this->__boundMin_inf_cost;
      pTVar2->__RRsetsSize = this->__numRRsets * 2;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"==>Influence via R2: ",0x15);
      poVar9 = std::ostream::_M_insert<double>(local_e8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", time: ",8);
      poVar9 = std::ostream::_M_insert<double>(this->__tRes->__RunningTime);
      local_179 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_179,1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"==>Time for RR sets and greedy: ",0x20);
      poVar9 = std::ostream::_M_insert<double>(local_168);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      local_158._0_8_ = local_e0;
      poVar9 = std::ostream::_M_insert<double>(local_178 - local_e0);
      local_179 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_179,1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"==>Time for Bound Computation: ",0x1f);
      poVar9 = std::ostream::_M_insert<double>((double)local_158._0_8_);
      local_179 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_179,1);
      uVar16 = 1;
    }
  } while (bVar17 || bVar3);
  return 0.0;
}

Assistant:

double Alg::opimb_naive(const Graph & graph, const double budget, const std::vector<double> & budget_list,
        const double epsilon, const double delta, const int mode) {
    Timer timerOPIMC("OPIM-B-NAIVE");
    std::cout << "mode: " << mode << std::endl;
    const double e_alpha = exp(1);
    const double approx = 0.5 * (1 - 1.0 / e_alpha);
    const double alpha = sqrt(log(6.0 / delta));
    const int k_max = cal_k_max(budget_list, budget);
    const int k_min = cal_k_min(budget_list, budget);
    int targetSize_min = int(budget / max_vector(budget_list));
    int targetSize_max = int(budget / min_vector_nonzero(budget_list));
    std::cout << "k_max: " << k_max << std::endl;
    std::cout << "k_min: " << k_min << std::endl;
    std::cout << "targetSize_max: " << targetSize_max << std::endl;
    std::cout << "targetSize_min: " << targetSize_min << std::endl;
    const auto theta_zero = (size_t) ((2.0 * __numV * pow2(0.5 * (1 - 1 / e_alpha) * alpha
            + sqrt(0.5 * (1 - 1 / e_alpha) * (k_max * log(__numV) + log(6.0 / delta))))) / (__numV));
    const auto theta_max = (size_t) ((2.0 * __numV * pow2(0.5 * (1 - 1 / e_alpha) * alpha
            + sqrt(0.5 * (1 - 1 / e_alpha) * (k_max * log(__numV) + log(6.0 / delta))))) / (pow2(epsilon) * k_max));
    const auto numIter = (size_t) log2(theta_max / theta_zero) + 1;
    const double a1 = log(numIter * 3.0 / delta);
    const double a2 = log(numIter * 3.0 / delta);
    double time1 = 0.0, time2 = 0.0;
    double timeb = 0.0;
    size_t idx = 0;
    int satisfy_count = 0;
    while (true) {
        std::cout << idx << std::endl;
        const auto numR = theta_zero << idx;
        timerOPIMC.get_operation_time();
        __hyperG.build_n_RRsets(numR); // R1
        __hyperGVldt.build_n_RRsets(numR); // R2
        std::cout << "# RR sets: " << numR << std::endl;
        __numRRsets = __hyperG.get_RR_sets_size();
        time1 += timerOPIMC.get_operation_time();
        const auto infSelf = max_cover_budget(graph, budget, budget_list, timeb, mode);
        time2 += timerOPIMC.get_operation_time();
        const auto infVldt = __hyperGVldt.self_inf_cal(__vecSeed);
        const auto degVldt = infVldt * __numRRsets / __numV;
        auto upperBound = infSelf / approx;
        const auto upperDegOPT = upperBound * __numRRsets / __numV;
        auto lowerSelect = pow2(sqrt(degVldt + a1 * 2.0 / 9.0) - sqrt(a1 / 2.0)) - a1 / 18.0;
        if (lowerSelect < 0) {
            lowerSelect = 0;
        }
        const auto upperOPT = pow2(sqrt(upperDegOPT + a2 / 2.0) + sqrt(a2 / 2.0));
        const auto approxOPIMC = lowerSelect / upperOPT;
        std::cout << " -->OPIM-B-NAIVE (" << idx + 1 << "/" << numIter << ") approx. (max-cover): " << approxOPIMC <<
                  " (" << infSelf / upperBound << "), #RR sets: " << __numRRsets << '\n';
        // Check whether the requirement is satisfied
        if (approxOPIMC >= approx - epsilon && satisfy_count == 1)
        {
            __tRes.set_approximation(approxOPIMC);
            __tRes.set_running_time(timerOPIMC.get_total_time());
            __tRes.set_influence(infVldt);
            __tRes.set_influence_original(infSelf);
            __tRes.set_seed_vec(__vecSeed);
            __tRes.set_seed_inf_vec(__vecSeed_inf);
            __tRes.set_seed_inf_cost_vec(__vecSeed_inf_cost);
            __tRes.set_boundmin_inf(__boundMin_inf);
            __tRes.set_boundmin_inf_cost(__boundMin_inf_cost);
            __tRes.set_RR_sets_size(__numRRsets * 2);
            std::cout << "==>Influence via R2: " << infVldt << ", time: " << __tRes.get_running_time() << '\n';
            std::cout << "==>Time for RR sets and greedy: " << time1 << ", " << time2 - timeb << '\n';
            std::cout << "==>Time for Bound Computation: " << timeb << '\n';
            return 0;
        }
        else if (approxOPIMC >= approx - epsilon && satisfy_count == 0) {
            satisfy_count = satisfy_count + 1;
        }
        idx = idx + 1;
    }
}